

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateCache::ReloadAllIfChanged(TemplateCache *this,ReloadType reload_type)

{
  Mutex *this_00;
  Template *this_01;
  Strip strip;
  char *s;
  __node_base *p_Var1;
  TemplateString local_50;
  
  this_00 = this->mutex_;
  Mutex::Lock(this_00);
  if (this->is_frozen_ == false) {
    p_Var1 = &(this->parsed_template_cache_->_M_h)._M_before_begin;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      *(undefined1 *)(p_Var1 + 4) = 1;
      if (reload_type == IMMEDIATE_RELOAD) {
        this_01 = (Template *)(p_Var1[3]._M_nxt)->_M_nxt;
        s = Template::original_filename(this_01);
        TemplateString::TemplateString(&local_50,s);
        strip = Template::strip(this_01);
        GetTemplateLocked(this,&local_50,strip,(TemplateCacheKey *)(p_Var1 + 1));
      }
    }
  }
  Mutex::Unlock(this_00);
  return;
}

Assistant:

void TemplateCache::ReloadAllIfChanged(ReloadType reload_type) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // do not reload a frozen cache.
    return;
  }
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();
       ++it) {
    it->second.should_reload = true;
    if (reload_type == IMMEDIATE_RELOAD) {
      const Template* tpl = it->second.refcounted_tpl->tpl();
      // Reload should always use the original filename.
      // For instance on reload, we may replace an existing template with a
      // new one that came earlier on the search path.
      GetTemplateLocked(tpl->original_filename(), tpl->strip(), it->first);
    }
  }
}